

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

void show_flag_cmds(CHAR_DATA *ch,flag_type *flag_table)

{
  char **ppcVar1;
  size_t sVar2;
  uint uVar3;
  flag_type *pfVar4;
  char buf1 [4608];
  char buf [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  local_2438[0] = '\0';
  if (flag_table->name != (char *)0x0) {
    pfVar4 = flag_table + 1;
    uVar3 = 0;
    do {
      if (pfVar4[-1].settable == true) {
        sprintf(local_1238,"%-19.18s");
        strcat(local_2438,local_1238);
        uVar3 = uVar3 + 1;
        if ((uVar3 & 3) == 0) {
          sVar2 = strlen(local_2438);
          (local_2438 + sVar2)[0] = '\n';
          (local_2438 + sVar2)[1] = '\r';
          local_2438[sVar2 + 2] = '\0';
        }
      }
      ppcVar1 = &pfVar4->name;
      pfVar4 = pfVar4 + 1;
    } while (*ppcVar1 != (char *)0x0);
    if ((uVar3 & 3) != 0) {
      sVar2 = strlen(local_2438);
      (local_2438 + sVar2)[0] = '\n';
      (local_2438 + sVar2)[1] = '\r';
      local_2438[sVar2 + 2] = '\0';
    }
  }
  send_to_char(local_2438,ch);
  return;
}

Assistant:

void show_flag_cmds(CHAR_DATA *ch, const struct flag_type *flag_table)
{
	char buf[MAX_STRING_LENGTH];
	char buf1[MAX_STRING_LENGTH];
	int flag;
	int col;

	buf1[0] = '\0';
	col = 0;

	for (flag = 0; flag_table[flag].name != nullptr; flag++)
	{
		if (flag_table[flag].settable)
		{
			sprintf(buf, "%-19.18s", flag_table[flag].name);
			strcat(buf1, buf);

			if (++col % 4 == 0)
				strcat(buf1, "\n\r");
		}
	}

	if (col % 4 != 0)
		strcat(buf1, "\n\r");

	send_to_char(buf1, ch);
}